

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int32 smooth_mixw(float32 ****out_mixw,float32 ***mixw_acc_a,float32 ***mixw_acc_b,uint32 n_mixw,
                 uint32 n_feat,uint32 n_gau,model_def_t *mdef)

{
  uint n_ci_state;
  acmod_set_t *acmod_set;
  model_def_entry_t *pmVar1;
  uint32 *puVar2;
  float32 *pfVar3;
  float *pfVar4;
  bool bVar5;
  bool bVar6;
  uint32 uVar7;
  uint32 uVar8;
  acmod_id_t aVar9;
  cmd_ln_t *pcVar10;
  float64 *dnom;
  float64 *dnom_00;
  float64 *dnom_01;
  float64 *pfVar11;
  uint32 **ci_mixw;
  uint32 **n_tied;
  float32 **lambda;
  float64 **lambda_acc;
  long lVar12;
  uchar *converged;
  ulong uVar13;
  long lVar14;
  char *pcVar15;
  ulong uVar16;
  uint n_cd_state;
  uint uVar17;
  uint32 *puVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  ulong d1;
  float cilambda;
  double dVar23;
  double dVar24;
  float64 fVar25;
  double dVar26;
  float fVar27;
  undefined8 in_stack_ffffffffffffff18;
  float32 ***pppfVar28;
  undefined8 uVar29;
  undefined4 uVar30;
  uint32 in_stack_ffffffffffffff30;
  
  pcVar10 = cmd_ln_get();
  dVar23 = cmd_ln_float_r(pcVar10,"-cilambda");
  acmod_set = mdef->acmod_set;
  uVar16 = (ulong)mdef->n_tied_state;
  dnom = (float64 *)
         __ckd_calloc__(uVar16,8,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                        ,0xca);
  dnom_00 = (float64 *)
            __ckd_calloc__(uVar16,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                           ,0xcb);
  dnom_01 = (float64 *)
            __ckd_calloc__(uVar16,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                           ,0xcc);
  if (uVar16 != 0) {
    uVar21 = 0;
    do {
      if (n_gau == 0) {
LAB_00103105:
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                ,0xdc,"Tied state %u never observed in the training corpus\n",uVar21 & 0xffffffff);
        dnom_01[uVar21] = 0.0;
        dnom_00[uVar21] = 0.0;
        fVar25 = 0.0;
        pfVar11 = dnom;
      }
      else {
        dVar24 = 0.0;
        dVar26 = 0.0;
        uVar13 = 0;
        do {
          dVar24 = dVar24 + (double)(float)(*mixw_acc_a[uVar21])[uVar13];
          dVar26 = dVar26 + (double)(float)(*mixw_acc_b[uVar21])[uVar13];
          uVar13 = uVar13 + 1;
        } while (n_gau != uVar13);
        if ((dVar24 <= 0.0) || (dVar26 <= 0.0)) goto LAB_00103105;
        dnom[uVar21] = (float64)(1.0 / dVar24);
        dnom_00[uVar21] = (float64)(1.0 / dVar26);
        fVar25 = (float64)(1.0 / (dVar26 + dVar24));
        pfVar11 = dnom_01;
      }
      pfVar11[uVar21] = fVar25;
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar16);
  }
  cilambda = (float)dVar23;
  n_ci_state = mdef->n_tied_ci_state;
  uVar7 = mdef->n_tied_state;
  n_cd_state = uVar7 - n_ci_state;
  if (n_cd_state == 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
            ,0xe9,"Only CI states.\n");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
            ,0xea,"    CI PDF == %.2f * CI + %.2f * UNIFORM\n",(double)cilambda,
            1.0 - (double)cilambda);
    accum_3d(mixw_acc_a,mixw_acc_b,uVar7,n_feat,n_gau);
    interp_counts_3d_uniform(mixw_acc_a,0,uVar7,n_feat,n_gau,(float32)cilambda);
    *out_mixw = mixw_acc_a;
    ckd_free_3d(mixw_acc_b);
    return 0;
  }
  uVar22 = mdef->max_n_state;
  uVar21 = (ulong)uVar22;
  uVar16 = 0;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
          ,0x105,"Interpolating %u CD states\n",(ulong)n_cd_state);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
          ,0x106,"%u states max/model\n",uVar21);
  d1 = (ulong)n_cd_state;
  uVar22 = uVar22 + 1;
  uVar13 = (ulong)uVar22;
  ci_mixw = (uint32 **)
            __ckd_calloc_2d__(d1,uVar13,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                              ,0x109);
  do {
    if (uVar13 != 0) {
      memset(ci_mixw[uVar16],0xff,uVar13 * 4);
    }
    uVar16 = uVar16 + 1;
  } while (d1 != uVar16);
  n_tied = (uint32 **)
           __ckd_calloc_2d__(d1,uVar13,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                             ,0x10f);
  uVar16 = 0;
  do {
    if (uVar22 != 0) {
      memset(n_tied[uVar16],0xff,uVar13 * 4);
    }
    uVar16 = uVar16 + 1;
  } while (d1 != uVar16);
  uVar7 = acmod_set_n_ci(acmod_set);
  uVar8 = acmod_set_n_acmod(acmod_set);
  uVar30 = (undefined4)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  if (uVar7 < uVar8) {
    pmVar1 = mdef->defn;
    uVar16 = (ulong)uVar7;
    do {
      aVar9 = acmod_set_base_phone(acmod_set,(acmod_id_t)uVar16);
      uVar30 = (undefined4)((ulong)in_stack_ffffffffffffff18 >> 0x20);
      uVar22 = pmVar1[uVar16].n_state;
      if (uVar22 != 0) {
        puVar2 = pmVar1[uVar16].state;
        uVar13 = 0;
        do {
          uVar17 = puVar2[uVar13];
          if (uVar17 != 0xffffffff && n_ci_state <= uVar17) {
            uVar17 = uVar17 - n_ci_state;
            puVar18 = ci_mixw[uVar17];
            uVar19 = 0;
            if (uVar21 != 0) {
              do {
                uVar20 = uVar19;
                if ((puVar18[uVar19] == 0xffffffff) ||
                   (puVar18[uVar19] == pmVar1[aVar9].state[uVar13])) break;
                uVar19 = uVar19 + 1;
                uVar20 = uVar21;
              } while (uVar21 != uVar19);
              uVar19 = uVar20 & 0xffffffff;
            }
            uVar7 = pmVar1[aVar9].state[uVar13];
            if (puVar18[uVar19] == uVar7) {
              puVar18 = n_tied[uVar17];
              uVar7 = puVar18[uVar19] + 1;
            }
            else {
              puVar18[uVar19] = uVar7;
              puVar18 = n_tied[uVar17];
              puVar18[uVar19] = 0;
              uVar7 = 1;
            }
            puVar18[uVar19] = uVar7;
            uVar22 = pmVar1[uVar16].n_state;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < uVar22);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar8);
  }
  lambda = (float32 **)
           __ckd_calloc_2d__(d1,3,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                             ,0x139);
  lambda_acc = (float64 **)
               __ckd_calloc_2d__(d1,3,8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                                 ,0x13c);
  uVar16 = 0;
  do {
    pfVar3 = lambda[uVar16];
    pfVar3[2] = 0.6;
    pfVar3[0] = 0.1;
    pfVar3[1] = 0.3;
    uVar16 = uVar16 + 1;
  } while (d1 != uVar16);
  pcVar10 = cmd_ln_get();
  lVar12 = cmd_ln_int_r(pcVar10,"-maxiter");
  converged = (uchar *)__ckd_calloc__(d1,1,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                                      ,0x148);
  if ((uint)lVar12 == 0) {
    uVar22 = 0;
    uVar17 = 0;
  }
  else {
    uVar22 = 0;
    uVar17 = 0;
    do {
      compute_mixw_lambda(lambda,lambda_acc,converged,n_cd_state,n_ci_state,ci_mixw,mixw_acc_b,
                          mixw_acc_a,dnom,in_stack_ffffffffffffff30,n_feat,n_gau);
      pppfVar28 = mixw_acc_a;
      compute_mixw_lambda(lambda,lambda_acc,converged,n_cd_state,n_ci_state,ci_mixw,mixw_acc_a,
                          mixw_acc_b,dnom_00,in_stack_ffffffffffffff30,n_feat,n_gau);
      uVar16 = 0;
      bVar6 = false;
      do {
        if (converged[uVar16] != '\x01') {
          pfVar11 = lambda_acc[uVar16];
          dVar23 = 0.0;
          lVar14 = 0;
          do {
            dVar23 = dVar23 + (double)pfVar11[lVar14];
            lVar14 = lVar14 + 1;
          } while (lVar14 != 3);
          if (dVar23 <= 1.199999978106707e-38) {
            pfVar3 = lambda[uVar16];
            pfVar3[0] = 0.33333334;
            pfVar3[1] = 0.33333334;
            pfVar3[2] = 0.33333334;
          }
          else {
            pfVar3 = lambda[uVar16];
            bVar5 = true;
            lVar14 = 0;
            do {
              fVar27 = (float)((double)pfVar11[lVar14] * (1.0 / dVar23));
              if (0.0001 < ABS((float)pfVar3[lVar14] - fVar27)) {
                bVar5 = false;
              }
              pfVar3[lVar14] = (float32)fVar27;
              pfVar11[lVar14] = 0.0;
              lVar14 = lVar14 + 1;
            } while (lVar14 != 3);
            if (!bVar5) goto LAB_00103682;
          }
          converged[uVar16] = '\x01';
          uVar22 = uVar22 + 1;
          if (uVar22 == n_cd_state) {
            bVar6 = true;
          }
        }
LAB_00103682:
        uVar16 = uVar16 + 1;
      } while (uVar16 != d1);
      uVar29 = CONCAT44((int)((ulong)pppfVar28 >> 0x20),n_cd_state);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
              ,0x188,"%u:%u:%u\n",(ulong)uVar17,(ulong)uVar22,uVar29);
      uVar30 = (undefined4)((ulong)uVar29 >> 0x20);
      uVar17 = uVar17 + 1;
    } while ((uVar17 < (uint)lVar12) && (!bVar6));
    if (bVar6) goto LAB_0010370a;
  }
  err_msg(ERR_WARN,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
          ,0x18d,"%u of %u states converged after %u iterations.\n",(ulong)uVar22,(ulong)n_cd_state,
          CONCAT44(uVar30,uVar17));
LAB_0010370a:
  puts("SUMMARY\n");
  puts(" State  Count A   Count B    Total    CD    CI    UNI   Cnv");
  puts("------ --------- --------- --------- ----- ----- ------ ---");
  uVar16 = 0;
  do {
    uVar21 = (ulong)(n_ci_state + (int)uVar16);
    pfVar4 = (float *)lambda[uVar16];
    pcVar15 = "y";
    if (converged[uVar16] == '\0') {
      pcVar15 = "n";
    }
    printf("%6u %.3e %.3e %.3e %.3f %.3f %.3f %s\n",
           -(ulong)(0.0 < (double)dnom[uVar21]) & (ulong)(1.0 / (double)dnom[uVar21]),
           -(ulong)(0.0 < (double)dnom_00[uVar21]) & (ulong)(1.0 / (double)dnom_00[uVar21]),
           -(ulong)(0.0 < (double)dnom_01[uVar21]) & (ulong)(1.0 / (double)dnom_01[uVar21]),
           (double)pfVar4[2],(double)pfVar4[1],(double)*pfVar4,uVar21,pcVar15);
    uVar16 = uVar16 + 1;
  } while (d1 != uVar16);
  interp_mixw(out_mixw,mixw_acc_a,mixw_acc_b,dnom_01,lambda,(float32)cilambda,ci_mixw,n_tied,
              n_cd_state,n_ci_state,n_mixw,n_feat,n_gau);
  return 0;
}

Assistant:

int32
smooth_mixw(float32 ****out_mixw,
	    
	    float32 ***mixw_acc_a,
	    float32 ***mixw_acc_b,

	    uint32 n_mixw,
	    uint32 n_feat,
	    uint32 n_gau,

	    model_def_t *mdef
	    )
{
    uint32 i, j, k;
    uint32 n_base, cd_start, n_phone;
    uint32 n_ci_state;
    uint32 n_cd_state;
    uint32 n_state;
    uint32 max_state_pm;
    float64 *dnom_a;
    float64 *dnom_b;
    float64 *dnom;
    float64 sum_a;
    float64 sum_b;
    float64 sum;
    float32 **lambda;
    float64 **lambda_acc;
    uint32 **ci_mixw;
    uint32 *ci_state;
    uint32 max_iter;
    uint32 tt;
    unsigned char *conv_flag;
    uint32 converged;
    uint32 state_converged;
    acmod_id_t base;
    uint32 iter;
    float64 norm;
    float32 prior_lambda;
    model_def_entry_t *defn;
    float32 cilambda = cmd_ln_float32("-cilambda");
    uint32 n_conv_state;
    uint32 **n_tied;
    acmod_set_t *acmod_set;

    acmod_set = mdef->acmod_set;

    /*
     * Compute normalization factors
     */
    n_state = mdef->n_tied_state;

    dnom_a = (float64 *)ckd_calloc(n_state, sizeof(float64));
    dnom_b = (float64 *)ckd_calloc(n_state, sizeof(float64));
    dnom   = (float64 *)ckd_calloc(n_state, sizeof(float64));

    /* compute the count normalization factor for all tied states */
    for (i = 0; i < n_state; i++) {
	sum_a = sum_b = sum = 0;
	for (k = 0; k < n_gau; k++) {
	    sum_a += mixw_acc_a[i][0][k];
	    sum_b += mixw_acc_b[i][0][k];
	}

	if ((sum_a > 0) && (sum_b > 0)) {
	    dnom_a[i] = 1.0 / sum_a;
	    dnom_b[i] = 1.0 / sum_b;
	    dnom[i] = 1.0 / (sum_a + sum_b);
	}
	else {
	    E_WARN("Tied state %u never observed in the training corpus\n", i);
	    dnom_a[i] = dnom_b[i] = dnom[i] = 0.0;
	}
    }

    /*
     * Interpolate CI states
     */

    n_cd_state = mdef->n_tied_state - mdef->n_tied_ci_state;
    n_ci_state = mdef->n_tied_ci_state;

    if (n_cd_state == 0) {
	E_INFO("Only CI states.\n");
	E_INFO("    CI PDF == %.2f * CI + %.2f * UNIFORM\n", cilambda, (1.0 - cilambda));
    
	/* add together counts for context independent states */
	accum_3d(mixw_acc_a, mixw_acc_b,
		 n_ci_state,	/* run over n_ci_state states */
		 n_feat, n_gau);

	/* interpolate CI distributions with uniform distribution */
	interp_counts_3d_uniform(mixw_acc_a,
				 0,		/* start state */
				 n_ci_state,	/* run length */
				 n_feat, n_gau,
				 cilambda);

	*out_mixw = mixw_acc_a;
	
	ckd_free_3d((void ***)mixw_acc_b);
	
	return S3_SUCCESS;
    }

    /*
     * Interpolate all states
     */

    max_state_pm = mdef->max_n_state;

    E_INFO("Interpolating %u CD states\n", n_cd_state);
    E_INFO("%u states max/model\n", max_state_pm);
    
    ci_mixw = (uint32 **)ckd_calloc_2d(n_cd_state, max_state_pm+1,
				       sizeof(uint32));
    for (i = 0; i < n_cd_state; i++)
	for (j = 0; j < max_state_pm+1; j++)
	    ci_mixw[i][j] = TYING_NO_ID;

    n_tied = (uint32 **)ckd_calloc_2d(n_cd_state, max_state_pm+1,
				      sizeof(uint32));
    for (i = 0; i < n_cd_state; i++)
	for (j = 0; j < max_state_pm+1; j++)
	    n_tied[i][j] = TYING_NO_ID;
    
    cd_start = n_base = acmod_set_n_ci(acmod_set);
    n_phone = acmod_set_n_acmod(acmod_set);

    defn = mdef->defn;
    
    /* for each cd state, find the id's of the associated ci states */
    for (i = cd_start; i < n_phone; i++) {
	base = acmod_set_base_phone(acmod_set, i);
	for (j = 0; j < defn[i].n_state; j++) {
	    if (defn[i].state[j] < n_ci_state) {
		/* This is a ci state, so skip it */

		continue;
	    }

	    if (defn[i].state[j] != TYING_NON_EMITTING) {
		tt = defn[i].state[j] - n_ci_state;

		ci_state = ci_mixw[tt];
		
		for (k = 0; (k < max_state_pm) && (ci_state[k] != TYING_NO_ID); k++) {
		    if (ci_state[k] == defn[base].state[j])
			break;	/* already on list */
		}

		if (ci_state[k] != defn[base].state[j]) {
		    /* not on list, so add */
		    ci_state[k] = defn[base].state[j];
		    n_tied[tt][k] = 0;
		}

		++n_tied[tt][k];	/* # of times CD and CI occur in same state position */
	    }
	}
    }
    
    lambda = (float32 **)ckd_calloc_2d(n_cd_state, N_DIST_TYPE,
					sizeof(float32));
    /* storage is returned zeroed */
    lambda_acc = (float64 **)ckd_calloc_2d(n_cd_state, N_DIST_TYPE,
					   sizeof(float64));

    for (i = 0; i < n_cd_state; i++) {
	/* biased initialization should help generally well trained models
	 * converge faster */
	lambda[i][(int)DIST_CD] = 0.6f;
	lambda[i][(int)DIST_CI] = 0.3f;
	lambda[i][(int)DIST_UNIFORM] = 0.1f;
    }

    max_iter = cmd_ln_int32("-maxiter");

    conv_flag = (unsigned char *)ckd_calloc(n_cd_state, sizeof(unsigned char));

    for (iter = 0, converged = FALSE, n_conv_state = 0;
	 (iter < max_iter) && (!converged);
	 iter++) {

	compute_mixw_lambda(lambda, lambda_acc, conv_flag,
			    n_cd_state, n_ci_state,
			    ci_mixw,
			    mixw_acc_b,
			    mixw_acc_a,
			    dnom_a,
			    n_mixw, n_feat, n_gau);

	compute_mixw_lambda(lambda, lambda_acc, conv_flag,
			    n_cd_state, n_ci_state,
			    ci_mixw,
			    mixw_acc_a,
			    mixw_acc_b,
			    dnom_b,
			    n_mixw, n_feat, n_gau);

	/* update lambdas and check for convergence */
	for (i = 0; i < n_cd_state; i++) {

	    if (conv_flag[i] == TRUE)	/* don't update converged states */
		continue;

	    norm = 0.0;
	    for (j = 0; j < N_DIST_TYPE; j++) {
		norm += lambda_acc[i][j];
	    }

	    if (norm > MIN_IEEE_NORM_POS_FLOAT32) {
		norm = 1.0f / norm;

		for (j = 0, state_converged = TRUE; j < N_DIST_TYPE; j++) {
		    prior_lambda = lambda[i][j];
		    lambda[i][j] = lambda_acc[i][j] * norm;

		    lambda_acc[i][j] = 0.0;

		    if (fabs(prior_lambda - lambda[i][j]) > CON_TH) {
			state_converged = FALSE;
		    }
		}
		    
	    }
	    else {
		for (j = 0; j < N_DIST_TYPE; j++) {
		    lambda[i][j] = 1.0f / N_DIST_TYPE;
		}
		state_converged = TRUE;
	    }
		
	    if (state_converged) {
		conv_flag[i] = TRUE;
		++n_conv_state;
		if (n_conv_state == n_cd_state) {
		    converged = TRUE;
		}
	    }
	}

	E_INFO("%u:%u:%u\n", iter, n_conv_state, n_cd_state);
    }

    if (!converged) {
	E_WARN("%u of %u states converged after %u iterations.\n",
	       n_conv_state, n_cd_state, iter);

    }

    printf("SUMMARY\n\n");
    printf(" State  Count A   Count B    Total    CD    CI    UNI   Cnv\n");
    printf("------ --------- --------- --------- ----- ----- ------ ---\n");
    for (i = 0; i < n_cd_state; i++) {

	j = n_ci_state + i;	/* CD tied state id */

	printf("%6u %.3e %.3e %.3e %.3f %.3f %.3f %s\n",
	       j,
	       (dnom_a[j] > 0 ? 1.0 / dnom_a[j] : 0.0),	/* count of partition A tied state j */
	       (dnom_b[j] > 0 ? 1.0 / dnom_b[j] : 0.0),	/* count of partition B tied state j */
	       (dnom[j] > 0 ? 1.0 / dnom[j] : 0.0),	/* count of partition A+B tied state j */
	       lambda[i][DIST_CD],
	       lambda[i][DIST_CI],
	       lambda[i][DIST_UNIFORM],
	       (conv_flag[i] ? "y" : "n"));
    }
    
    interp_mixw(out_mixw,
		mixw_acc_a, mixw_acc_b, dnom,
		lambda, cilambda,
		ci_mixw, n_tied,
		n_cd_state, n_ci_state,
		n_mixw, n_feat, n_gau);

    return S3_SUCCESS;
}